

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

void pop_source(Context_conflict1 *ctx)

{
  IncludeState *item;
  Conditional *pCVar1;
  Conditional *next;
  Conditional *cond;
  IncludeState *state;
  Context_conflict1 *ctx_local;
  
  item = ctx->include_stack;
  if (item == (IncludeState *)0x0) {
    __assert_fail("state != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x23c,"void pop_source(Context *)");
  }
  if (item != (IncludeState *)0x0) {
    if (item->close_callback != (MOJOSHADER_includeClose)0x0) {
      (*item->close_callback)(item->source_base,ctx->malloc,ctx->free,ctx->malloc_data);
    }
    next = item->conditional_stack;
    while (next != (Conditional *)0x0) {
      pCVar1 = next->next;
      put_conditional(ctx,next);
      next = pCVar1;
    }
    ctx->include_stack = item->next;
    put_include(ctx,item);
  }
  return;
}

Assistant:

static void pop_source(Context *ctx)
{
    IncludeState *state = ctx->include_stack;
    assert(state != NULL);  // more pops than pushes!
    if (state == NULL)
        return;

    if (state->close_callback)
    {
        state->close_callback(state->source_base, ctx->malloc,
                              ctx->free, ctx->malloc_data);
    } // if

    // state->filename is a pointer to the filename cache; don't free it here!

    Conditional *cond = state->conditional_stack;
    while (cond)
    {
        Conditional *next = cond->next;
        put_conditional(ctx, cond);
        cond = next;
    } // while

    ctx->include_stack = state->next;

    print_debug_lexing_position(ctx->include_stack);

    put_include(ctx, state);
}